

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall DBOPL::Operator::UpdateAttack(Operator *this,Chip *chip)

{
  if (this->reg60 < 0x10) {
    this->attackAdd = 0;
    this->rateZero = this->rateZero | 0x10;
    return;
  }
  this->attackAdd = chip->attackRates[(byte)((this->reg60 >> 2 & 0x3c) + this->ksr)];
  this->rateZero = this->rateZero & 0xef;
  return;
}

Assistant:

inline void Operator::UpdateAttack( const Chip* chip ) {
	Bit8u rate = reg60 >> 4;
	if ( rate ) {
		Bit8u val = (rate << 2) + ksr;
		attackAdd = chip->attackRates[ val ];
		rateZero &= ~(1 << ATTACK);
	} else {
		attackAdd = 0;
		rateZero |= (1 << ATTACK);
	}
}